

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

IdentPtr __thiscall Token::CreateIdentifier(Token *this,HashTbl *hashTbl)

{
  uint32 cch;
  code *pcVar1;
  bool bVar2;
  tokens token;
  undefined4 *puVar3;
  IdentPtr pIVar4;
  char *prgch;
  
  if ((this->loc).filename.data_ != (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x37,"(this->u.pid == nullptr)","this->u.pid == nullptr");
    if (!bVar2) goto LAB_00efde7c;
    *puVar3 = 0;
  }
  prgch = (char *)(this->loc).filename.size_;
  token = (this->loc).field_1.field_0.last_column;
  if (prgch == (char *)0x0) {
    if (0x4d < (int)token) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x40,"(IsReservedWord())","IsReservedWord()");
      if (!bVar2) goto LAB_00efde7c;
      *puVar3 = 0;
      token = (this->loc).field_1.field_0.last_column;
    }
    pIVar4 = HashTbl::PidFromTk(hashTbl,token);
  }
  else {
    if (token != tkID) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x3a,"(IsIdentifier())","IsIdentifier()");
      if (!bVar2) {
LAB_00efde7c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      prgch = (char *)(this->loc).filename.size_;
    }
    cch = (this->loc).field_1.field_0.line;
    pIVar4 = HashTbl::PidHashNameLen<char>(hashTbl,prgch,prgch + (int)cch,cch);
  }
  (this->loc).filename.data_ = (char *)pIVar4;
  return pIVar4;
}

Assistant:

IdentPtr Token::CreateIdentifier(HashTbl * hashTbl)
{
    Assert(this->u.pid == nullptr);
    if (this->u.pchMin)
    {
        Assert(IsIdentifier());
        IdentPtr pid = hashTbl->PidHashNameLen(this->u.pchMin, this->u.pchMin + this->u.length, this->u.length);
        this->u.pid = pid;
        return pid;
    }

    Assert(IsReservedWord());

    IdentPtr pid = hashTbl->PidFromTk(tk);
    this->u.pid = pid;
    return pid;
}